

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cc
# Opt level: O0

int __thiscall
iqnet::Connector_base::connect(Connector_base *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  shared_count *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  Client_timeout *this_01;
  sockaddr *__addr_00;
  Timeout local_104;
  int ms;
  bool done;
  undefined1 local_c8 [8];
  Connect_processor connector;
  Reactor<iqnet::Null_lock> reactor;
  int timeout_local;
  Connector_base *this_local;
  
  this_00 = &connector.sock.peer.impl_.pn;
  Reactor<iqnet::Null_lock>::Reactor((Reactor<iqnet::Null_lock> *)this_00);
  Connect_processor::Connect_processor((Connect_processor *)local_c8,(Reactor_base *)this_00);
  uVar2 = Socket::connect((Socket *)&connector.reactor,(int)this + 8,__addr_00,__len);
  if ((uVar2 & 1) == 0) {
    Reactor<iqnet::Null_lock>::register_handler
              ((Reactor<iqnet::Null_lock> *)&connector.sock.peer.impl_.pn,(Event_handler *)local_c8,
               OUTPUT);
    if (__fd < 1) {
      local_104 = -1;
    }
    else {
      local_104 = __fd * 1000;
    }
    bVar1 = Reactor<iqnet::Null_lock>::handle_events
                      ((Reactor<iqnet::Null_lock> *)&connector.sock.peer.impl_.pn,local_104);
    if (!bVar1) {
      Socket::close((Socket *)&connector.reactor,local_104);
      this_01 = (Client_timeout *)__cxa_allocate_exception(0x18);
      iqxmlrpc::Client_timeout::Client_timeout(this_01);
      __cxa_throw(this_01,&iqxmlrpc::Client_timeout::typeinfo,
                  iqxmlrpc::Client_timeout::~Client_timeout);
    }
    iVar3 = (*this->_vptr_Connector_base[2])(this,&connector.reactor);
  }
  else {
    iVar3 = (*this->_vptr_Connector_base[2])(this,&connector.reactor);
  }
  Connect_processor::~Connect_processor((Connect_processor *)local_c8);
  Reactor<iqnet::Null_lock>::~Reactor((Reactor<iqnet::Null_lock> *)&connector.sock.peer.impl_.pn);
  return iVar3;
}

Assistant:

iqxmlrpc::Client_connection*
Connector_base::connect(int timeout)
{
  Reactor<Null_lock> reactor;
  Connect_processor connector(reactor);
  bool done = connector.sock.connect( peer_addr );

  if (done)
    return create_connection( connector.sock );

  reactor.register_handler( &connector, Reactor_base::OUTPUT );

  int ms = timeout > 0 ? timeout*1000 : -1;
  if (!reactor.handle_events(ms)) {
    connector.sock.close();
    throw iqxmlrpc::Client_timeout();
  }

  return create_connection( connector.sock );
}